

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heavylight.cpp
# Opt level: O0

int dfsHLD(int a)

{
  bool bVar1;
  int iVar2;
  reference piVar3;
  iterator iStack_28;
  int b;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int a_local;
  
  sub[a] = 1;
  __end1 = std::vector<int,_std::allocator<int>_>::begin(g + a);
  iStack_28 = std::vector<int,_std::allocator<int>_>::end(g + a);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd8), bVar1) {
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    if (*piVar3 != pred[a][0]) {
      iVar2 = dfsHLD(*piVar3);
      sub[a] = iVar2 + sub[a];
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  return sub[a];
}

Assistant:

int dfsHLD(int a) {
    sub[a] = 1;
    for (auto b : g[a]) {
        if (b == pred[a][0]) continue;
        sub[a] += dfsHLD(b);
    }
    return sub[a];
}